

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O1

void __thiscall Iex_3_2::BaseExc::BaseExc(BaseExc *this,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  *(undefined ***)this = &PTR__EdircorruptedExc_00174618;
  paVar1 = &(this->_message).field_2;
  (this->_message)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (s->_M_dataplus)._M_p;
  paVar2 = &s->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&s->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->_message).field_2 + 8) = uVar4;
  }
  else {
    (this->_message)._M_dataplus._M_p = pcVar3;
    (this->_message).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->_message)._M_string_length = s->_M_string_length;
  (s->_M_dataplus)._M_p = (pointer)paVar2;
  s->_M_string_length = 0;
  (s->field_2)._M_local_buf[0] = '\0';
  if ((anonymous_namespace)::currentStackTracer_abi_cxx11_ == (code *)0x0) {
    (this->_stackTrace)._M_dataplus._M_p = (pointer)&(this->_stackTrace).field_2;
    (this->_stackTrace)._M_string_length = 0;
    (this->_stackTrace).field_2._M_local_buf[0] = '\0';
  }
  else {
    (*(anonymous_namespace)::currentStackTracer_abi_cxx11_)(&this->_stackTrace);
  }
  return;
}

Assistant:

BaseExc::BaseExc (std::string&& s)
    : _message (std::move (s))
    , _stackTrace (currentStackTracer ? currentStackTracer () : std::string ())
{
    // empty
}